

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnExport
          (SharedValidator *this,Location *loc,ExternalKind kind,Var *item_var,string_view name)

{
  Result RVar1;
  iterator iVar2;
  Enum EVar3;
  Var *this_00;
  string name_str;
  string_view local_1c8;
  string local_1b8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_1c8.size_ = name.size_;
  local_1c8.data_ = name.data_;
  string_view::to_string_abi_cxx11_(&local_1b8,&local_1c8);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->export_names_)._M_t,&local_1b8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->export_names_)._M_t._M_impl.super__Rb_tree_header)
  {
    EVar3 = Ok;
  }
  else {
    RVar1 = PrintError(this,loc,"duplicate export \"%.*s\"",local_1c8.size_ & 0xffffffff,
                       local_1c8.data_);
    EVar3 = (Enum)(RVar1.enum_ == Error);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->export_names_,&local_1b8);
  switch(kind) {
  case First:
    this_00 = &local_78;
    Var::Var(this_00,item_var);
    RVar1 = CheckFuncIndex(this,this_00,(FuncType *)0x0);
    break;
  case Table:
    this_00 = &local_c0;
    Var::Var(this_00,item_var);
    RVar1 = CheckTableIndex(this,this_00,(TableType *)0x0);
    break;
  case Memory:
    this_00 = &local_108;
    Var::Var(this_00,item_var);
    RVar1 = CheckMemoryIndex(this,this_00,(MemoryType *)0x0);
    break;
  case Global:
    this_00 = &local_150;
    Var::Var(this_00,item_var);
    RVar1 = CheckGlobalIndex(this,this_00,(GlobalType *)0x0);
    break;
  case Event:
    this_00 = &local_198;
    Var::Var(this_00,item_var);
    RVar1 = CheckEventIndex(this,this_00,(EventType *)0x0);
    break;
  default:
    goto switchD_0017c1c5_default;
  }
  EVar3 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar3);
  Var::~Var(this_00);
switchD_0017c1c5_default:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnExport(const Location& loc,
                                 ExternalKind kind,
                                 Var item_var,
                                 string_view name) {
  Result result = Result::Ok;
  auto name_str = name.to_string();
  if (export_names_.find(name_str) != export_names_.end()) {
    result |= PrintError(loc, "duplicate export \"" PRIstringview "\"",
                         WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  export_names_.insert(name_str);

  switch (kind) {
    case ExternalKind::Func:
      result |= CheckFuncIndex(item_var);
      break;

    case ExternalKind::Table:
      result |= CheckTableIndex(item_var);
      break;

    case ExternalKind::Memory:
      result |= CheckMemoryIndex(item_var);
      break;

    case ExternalKind::Global:
      result |= CheckGlobalIndex(item_var);
      break;

    case ExternalKind::Event:
      result |= CheckEventIndex(item_var);
      break;
  }
  return result;
}